

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.h
# Opt level: O1

void __thiscall crnlib::qdxt1::cluster_id::set(cluster_id *this,vector<unsigned_int> *indices)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  long lVar5;
  uint32 uVar6;
  ulong uVar7;
  
  uVar1 = indices->m_size;
  uVar2 = (this->m_cells).m_size;
  if (uVar2 != uVar1) {
    if (uVar2 <= uVar1) {
      if ((this->m_cells).m_capacity < uVar1) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)this,uVar1,uVar2 + 1 == uVar1,4,(object_mover)0x0,false);
      }
      uVar2 = (this->m_cells).m_size;
      memset((this->m_cells).m_p + uVar2,0,(ulong)(uVar1 - uVar2) << 2);
    }
    (this->m_cells).m_size = uVar1;
  }
  if (indices->m_size != 0) {
    puVar3 = indices->m_p;
    puVar4 = (this->m_cells).m_p;
    uVar7 = 0;
    do {
      puVar4[uVar7] = puVar3[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar7 < indices->m_size);
  }
  uVar1 = (this->m_cells).m_size;
  uVar7 = (ulong)uVar1;
  if (uVar7 != 0) {
    puVar3 = (this->m_cells).m_p;
    lVar5 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar1 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::__introsort_loop<unsigned_int*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar3 + uVar7,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar3,puVar3 + uVar7);
  }
  uVar6 = fast_hash((this->m_cells).m_p,(this->m_cells).m_size << 2);
  this->m_hash = (ulong)uVar6;
  return;
}

Assistant:

void set(const crnlib::vector<uint>& indices)
            {
                m_cells.resize(indices.size());

                for (uint i = 0; i < indices.size(); i++)
                {
                    m_cells[i] = static_cast<uint32>(indices[i]);
                }

                std::sort(m_cells.begin(), m_cells.end());

                m_hash = fast_hash(&m_cells[0], sizeof(m_cells[0]) * m_cells.size());
            }